

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

void ucnv_fromUnicode_63(UConverter *cnv,char **target,char *targetLimit,UChar **source,
                        UChar *sourceLimit,int32_t *offsets,UBool flush,UErrorCode *err)

{
  char *pcVar1;
  UBool UVar2;
  ulong uVar3;
  UChar *pUVar4;
  int32_t *local_78;
  UChar *local_70;
  UConverterFromUnicodeArgs local_68;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((target != (char **)0x0 && cnv != (UConverter *)0x0) && source != (UChar **)0x0) {
      local_68.source = *source;
      pcVar1 = *target;
      pUVar4 = (UChar *)0xffffffffffffffff;
      if (sourceLimit < (UChar *)0xffffffff80000001) {
        pUVar4 = (UChar *)((long)sourceLimit + 0x7fffffff);
      }
      pUVar4 = (UChar *)((long)sourceLimit - (ulong)(pUVar4 == sourceLimit));
      if ((pcVar1 <= targetLimit && local_68.source <= pUVar4) &&
         (uVar3 = (long)pUVar4 - (long)local_68.source,
         (pUVar4 < local_68.source || uVar3 == 0) || uVar3 < 0x7fffffff)) {
        if (((uVar3 & 1) == 0) &&
           ((ulong)((long)targetLimit - (long)pcVar1) >> 0x1f == 0 ||
            (targetLimit < pcVar1 || (long)targetLimit - (long)pcVar1 == 0))) {
          local_78 = offsets;
          if (('\0' < cnv->charErrorBufferLength) &&
             (local_70 = local_68.source,
             UVar2 = ucnv_outputOverflowFromUnicode(cnv,target,targetLimit,&local_78,err),
             local_68.source = local_70, UVar2 != '\0')) {
            return;
          }
          if (((flush == '\0') && (local_68.source == pUVar4)) && (-1 < cnv->preFromULength)) {
            return;
          }
          local_68.flush = flush;
          local_68.offsets = local_78;
          local_68.target = *target;
          local_68.size = 0x38;
          local_68.converter = cnv;
          local_68.sourceLimit = pUVar4;
          local_68.targetLimit = targetLimit;
          _fromUnicodeWithCallback(&local_68,err);
          *source = local_68.source;
          *target = local_68.target;
          return;
        }
      }
    }
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_fromUnicode(UConverter *cnv,
                 char **target, const char *targetLimit,
                 const UChar **source, const UChar *sourceLimit,
                 int32_t *offsets,
                 UBool flush,
                 UErrorCode *err) {
    UConverterFromUnicodeArgs args;
    const UChar *s;
    char *t;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return;
    }

    if(cnv==NULL || target==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    s=*source;
    t=*target;

    if ((const void *)U_MAX_PTR(sourceLimit) == (const void *)sourceLimit) {
        /*
        Prevent code from going into an infinite loop in case we do hit this
        limit. The limit pointer is expected to be on a UChar * boundary.
        This also prevents the next argument check from failing.
        */
        sourceLimit = (const UChar *)(((const char *)sourceLimit) - 1);
    }

    /*
     * All these conditions should never happen.
     *
     * 1) Make sure that the limits are >= to the address source or target
     *
     * 2) Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be targetLimit=t+0x7fffffff; for example.
     *
     * 3) Make sure that the user didn't incorrectly cast a UChar * pointer
     * to a char * pointer and provide an incomplete UChar code unit.
     */
    if (sourceLimit<s || targetLimit<t ||
        ((size_t)(sourceLimit-s)>(size_t)0x3fffffff && sourceLimit>s) ||
        ((size_t)(targetLimit-t)>(size_t)0x7fffffff && targetLimit>t) ||
        (((const char *)sourceLimit-(const char *)s) & 1) != 0)
    {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    /* output the target overflow buffer */
    if( cnv->charErrorBufferLength>0 &&
        ucnv_outputOverflowFromUnicode(cnv, target, targetLimit, &offsets, err)
    ) {
        /* U_BUFFER_OVERFLOW_ERROR */
        return;
    }
    /* *target may have moved, therefore stop using t */

    if(!flush && s==sourceLimit && cnv->preFromULength>=0) {
        /* the overflow buffer is emptied and there is no new input: we are done */
        return;
    }

    /*
     * Do not simply return with a buffer overflow error if
     * !flush && t==targetLimit
     * because it is possible that the source will not generate any output.
     * For example, the skip callback may be called;
     * it does not output anything.
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=flush;
    args.offsets=offsets;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=*target;
    args.targetLimit=targetLimit;
    args.size=sizeof(args);

    _fromUnicodeWithCallback(&args, err);

    *source=args.source;
    *target=args.target;
}